

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e4c4a4::DescriptorImpl::ExpandPrivate
          (DescriptorImpl *this,int pos,SigningProvider *provider,FlatSigningProvider *out)

{
  pointer puVar1;
  PubkeyProvider *pPVar2;
  pointer puVar3;
  int iVar4;
  pointer puVar5;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  *arg;
  pointer puVar6;
  long in_FS_OFFSET;
  CKey key;
  undefined1 local_a0 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_98;
  CPubKey local_8d;
  CKeyID local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      local_a0[0] = false;
      local_98._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
      pPVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
      iVar4 = (*pPVar2->_vptr_PubkeyProvider[8])(pPVar2,pos,provider,(CKey *)local_a0);
      if ((char)iVar4 != '\0') {
        CKey::GetPubKey(&local_8d,(CKey *)local_a0);
        CPubKey::GetID(&local_4c,&local_8d);
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
        ::_M_emplace_unique<CKeyID,CKey&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                    *)&out->keys,&local_4c,(CKey *)local_a0);
      }
      if (local_98._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_98,
                   local_98._M_head_impl);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  puVar3 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->m_subdescriptor_args).
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    ExpandPrivate((puVar6->_M_t).
                  super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
                  _M_head_impl,pos,provider,out);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpandPrivate(int pos, const SigningProvider& provider, FlatSigningProvider& out) const final
    {
        for (const auto& p : m_pubkey_args) {
            CKey key;
            if (!p->GetPrivKey(pos, provider, key)) continue;
            out.keys.emplace(key.GetPubKey().GetID(), key);
        }
        for (const auto& arg : m_subdescriptor_args) {
            arg->ExpandPrivate(pos, provider, out);
        }
    }